

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback
          (EpsCopyOutputStream *this,uint8_t *ptr)

{
  uint8_t *puVar1;
  char *failure_msg;
  int line;
  uint uVar2;
  LogMessageFatal local_20;
  
  while( true ) {
    if (this->had_error_ == true) {
      return this->buffer_;
    }
    uVar2 = (int)ptr - (int)this->end_;
    if ((int)uVar2 < 0) break;
    if (0x10 < uVar2) {
      failure_msg = "overrun <= kSlopBytes";
      line = 0x377;
      goto LAB_00c99947;
    }
    puVar1 = Next(this);
    ptr = puVar1 + (uVar2 & 0x1f);
    if (ptr < this->end_) {
      return ptr;
    }
  }
  failure_msg = "overrun >= 0";
  line = 0x376;
LAB_00c99947:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

uint8_t* EpsCopyOutputStream::EnsureSpaceFallback(uint8_t* ptr) {
  do {
    if (ABSL_PREDICT_FALSE(had_error_)) return buffer_;
    int overrun = ptr - end_;
    ABSL_DCHECK(overrun >= 0);           // NOLINT
    ABSL_DCHECK(overrun <= kSlopBytes);  // NOLINT
    ptr = Next() + overrun;
  } while (ptr >= end_);
  ABSL_DCHECK(ptr < end_);  // NOLINT
  return ptr;
}